

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::OstreamView
          (OstreamView *this,LogMessageData *message_data)

{
  uint64_t max_size;
  pointer pcVar1;
  size_type sVar2;
  Span<char> *pSVar3;
  Span<char> SVar4;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__OstreamView_00543d18;
  this->data_ = message_data;
  pSVar3 = LogMessageData::encoded_remaining(message_data);
  max_size = pSVar3->len_;
  (this->encoded_remaining_copy_).ptr_ = pSVar3->ptr_;
  (this->encoded_remaining_copy_).len_ = max_size;
  (this->message_start_).ptr_ = (pointer)0x0;
  (this->message_start_).len_ = 0;
  (this->string_start_).ptr_ = (pointer)0x0;
  (this->string_start_).len_ = 0;
  SVar4 = EncodeMessageStart(7,max_size,&this->encoded_remaining_copy_);
  this->message_start_ = SVar4;
  SVar4 = EncodeMessageStart(1,(this->encoded_remaining_copy_).len_,&this->encoded_remaining_copy_);
  this->string_start_ = SVar4;
  pcVar1 = (this->encoded_remaining_copy_).ptr_;
  sVar2 = (this->encoded_remaining_copy_).len_;
  *(pointer *)&this->field_0x28 = pcVar1;
  *(pointer *)&this->field_0x20 = pcVar1;
  *(pointer *)&this->field_0x30 = pcVar1 + sVar2;
  std::ios::rdbuf((streambuf *)
                  (&this->data_->manipulated + *(long *)(*(long *)&this->data_->manipulated + -0x18)
                  ));
  return;
}

Assistant:

LogMessage::OstreamView::OstreamView(LogMessageData& message_data)
    : data_(message_data), encoded_remaining_copy_(data_.encoded_remaining()) {
  // This constructor sets the `streambuf` up so that streaming into an attached
  // ostream encodes string data in-place.  To do that, we write appropriate
  // headers into the buffer using a copy of the buffer view so that we can
  // decide not to keep them later if nothing is ever streamed in.  We don't
  // know how much data we'll get, but we can use the size of the remaining
  // buffer as an upper bound and fill in the right size once we know it.
  message_start_ =
      EncodeMessageStart(EventTag::kValue, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  string_start_ =
      EncodeMessageStart(ValueTag::kString, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  setp(encoded_remaining_copy_.data(),
       encoded_remaining_copy_.data() + encoded_remaining_copy_.size());
  data_.manipulated.rdbuf(this);
}